

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O3

void gimage::clipRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float ***pppfVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = image->depth;
  if (0 < (long)iVar2) {
    lVar3 = image->width;
    lVar4 = image->height;
    lVar7 = 0;
    do {
      if (0 < lVar4) {
        pppfVar5 = image->img;
        lVar8 = 0;
        do {
          if (0 < lVar3) {
            pfVar6 = pppfVar5[lVar7][lVar8];
            lVar9 = 0;
            do {
              fVar1 = pfVar6[lVar9];
              if ((fVar1 < from) || (to < fVar1)) {
                pfVar6[lVar9] =
                     (float)(~-(uint)(to < fVar1) & (uint)from | -(uint)(to < fVar1) & (uint)to);
              }
              lVar9 = lVar9 + 1;
            } while (lVar3 != lVar9);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar2);
  }
  return;
}

Assistant:

void clipRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);
        if (v < from) image.set(i, k, d, from);
        if (v > to) image.set(i, k, d, to);
      }
    }
  }
}